

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O1

void predict(log_multi *b,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  uint32_t uVar2;
  label_t lVar3;
  node *pnVar4;
  node *pnVar5;
  ulong uVar6;
  
  lVar3 = (ec->l).multi;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  pnVar5 = (b->nodes)._begin;
  if (pnVar5->internal == true) {
    uVar6 = 0;
    do {
      uVar2 = pnVar5->base_predictor;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar2);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar2 * *(int *)(base + 0xe0));
      pnVar4 = (b->nodes)._begin;
      uVar6 = (ulong)(&pnVar4[uVar6].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0];
      pnVar5 = pnVar4 + uVar6;
    } while (pnVar4[uVar6].internal != false);
  }
  (ec->pred).scalar = (float)pnVar5->max_count_label;
  (ec->l).multi = lVar3;
  return;
}

Assistant:

void predict(log_multi& b, single_learner& base, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  uint32_t cn = 0;
  uint32_t depth = 0;
  while (b.nodes[cn].internal)
  {
    base.predict(ec, b.nodes[cn].base_predictor);  // depth
    cn = descend(b.nodes[cn], ec.pred.scalar);
    depth++;
  }
  ec.pred.multiclass = b.nodes[cn].max_count_label;
  ec.l.multi = mc;
}